

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::remapEntryPointIO
          (HlslParseContext *this,TFunction *function,TVariable **returnValue,
          TVector<glslang::TVariable_*> *inputs,TVector<glslang::TVariable_*> *outputs)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TVariable *pTVar4;
  TType *copyOf;
  TArraySizes *this_00;
  undefined4 extraout_var_02;
  TQualifier *qualifier;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  char *pcVar5;
  TVariable *local_100;
  TVariable *argAsGlobal_1;
  TVariable *argAsGlobal;
  TType *paramType;
  TArraySizes *pTStack_e0;
  int i;
  TArraySizes *arraySizes;
  TType outputType;
  anon_class_8_1_8991fb9c makeIoVariable;
  anon_class_8_1_8991fb9c synthesizeEditedInput;
  TVector<glslang::TVariable_*> *outputs_local;
  TVector<glslang::TVariable_*> *inputs_local;
  TVariable **returnValue_local;
  TFunction *function_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_01;
  
  outputType.spirvType = (TSpirvType *)this;
  makeIoVariable.this = this;
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])();
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))();
  if (iVar3 == 0) {
    *returnValue = (TVariable *)0x0;
  }
  else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])();
    pTVar4 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)&outputType.spirvType,"@entryPointOutput",
                        (TType *)CONCAT44(extraout_var_00,iVar3),EvqVaryingOut);
    *returnValue = pTVar4;
    TType::TType((TType *)&arraySizes,EbtVoid,EvqTemporary,1,0,0,false);
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])();
    copyOf = (TType *)CONCAT44(extraout_var_01,iVar3);
    TType::shallowCopy((TType *)&arraySizes,copyOf);
    this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)copyOf);
    TArraySizes::TArraySizes(this_00);
    pTStack_e0 = this_00;
    iVar3 = TIntermediate::getVertices
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    TArraySizes::addInnerSize(this_00,iVar3);
    TType::transferArraySizes((TType *)&arraySizes,pTStack_e0);
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])();
    qualifier = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x50))();
    clearUniformInputOutput(this,qualifier);
    pTVar4 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)&outputType.spirvType,"@entryPointOutput",
                        (TType *)&arraySizes,EvqVaryingOut);
    *returnValue = pTVar4;
    TType::~TType((TType *)&arraySizes);
  }
  else {
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])();
    pTVar4 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)&outputType.spirvType,"@entryPointOutput",
                        (TType *)CONCAT44(extraout_var_03,iVar3),EvqVaryingOut);
    *returnValue = pTVar4;
  }
  for (paramType._4_4_ = 0; uVar1 = paramType._4_4_,
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(), (int)uVar1 < iVar3;
      paramType._4_4_ = paramType._4_4_ + 1) {
    iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)paramType._4_4_);
    argAsGlobal = *(TVariable **)(CONCAT44(extraout_var_04,iVar3) + 8);
    iVar3 = (*(argAsGlobal->super_TSymbol)._vptr_TSymbol[10])();
    bVar2 = TQualifier::isParamInput((TQualifier *)CONCAT44(extraout_var_05,iVar3));
    if (bVar2) {
      remapEntryPointIO::anon_class_8_1_8991fb9c::operator()(&makeIoVariable,(TType *)argAsGlobal);
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)paramType._4_4_);
      pcVar5 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (*(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            **)CONCAT44(extraout_var_06,iVar3));
      argAsGlobal_1 =
           remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&outputType.spirvType,pcVar5,(TType *)argAsGlobal,
                      EvqVaryingIn);
      std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::push_back
                (&inputs->
                  super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ,&argAsGlobal_1);
    }
    iVar3 = (*(argAsGlobal->super_TSymbol)._vptr_TSymbol[10])();
    bVar2 = TQualifier::isParamOutput((TQualifier *)CONCAT44(extraout_var_07,iVar3));
    if (bVar2) {
      iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)paramType._4_4_);
      pcVar5 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (*(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            **)CONCAT44(extraout_var_08,iVar3));
      local_100 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)&outputType.spirvType,pcVar5,
                             (TType *)argAsGlobal,EvqVaryingOut);
      std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::push_back
                (&outputs->
                  super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ,&local_100);
    }
  }
  return;
}

Assistant:

void HlslParseContext::remapEntryPointIO(TFunction& function, TVariable*& returnValue,
    TVector<TVariable*>& inputs, TVector<TVariable*>& outputs)
{
    // We might have in input structure type with no decorations that caused it
    // to look like an input type, yet it has (e.g.) interpolation types that
    // must be modified that turn it into an input type.
    // Hence, a missing ioTypeMap for 'input' might need to be synthesized.
    const auto synthesizeEditedInput = [this](TType& type) {
        // True if a type needs to be 'flat'
        const auto needsFlat = [](const TType& type) {
            return type.containsBasicType(EbtInt) ||
                    type.containsBasicType(EbtUint) ||
                    type.containsBasicType(EbtInt64) ||
                    type.containsBasicType(EbtUint64) ||
                    type.containsBasicType(EbtBool) ||
                    type.containsBasicType(EbtDouble);
        };

        if (language == EShLangFragment && needsFlat(type)) {
            if (type.isStruct()) {
                TTypeList* finalList = nullptr;
                auto it = ioTypeMap.find(type.getStruct());
                if (it == ioTypeMap.end() || it->second.input == nullptr) {
                    // Getting here means we have no input struct, but we need one.
                    auto list = new TTypeList;
                    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
                        TType* newType = new TType;
                        newType->shallowCopy(*member->type);
                        TTypeLoc typeLoc = { newType, member->loc };
                        list->push_back(typeLoc);
                    }
                    // install the new input type
                    if (it == ioTypeMap.end()) {
                        tIoKinds newLists = { list, nullptr, nullptr };
                        ioTypeMap[type.getStruct()] = newLists;
                    } else
                        it->second.input = list;
                    finalList = list;
                } else
                    finalList = it->second.input;
                // edit for 'flat'
                for (auto member = finalList->begin(); member != finalList->end(); ++member) {
                    if (needsFlat(*member->type)) {
                        member->type->getQualifier().clearInterpolation();
                        member->type->getQualifier().flat = true;
                    }
                }
            } else {
                type.getQualifier().clearInterpolation();
                type.getQualifier().flat = true;
            }
        }
    };

    // Do the actual work to make a type be a shader input or output variable,
    // and clear the original to be non-IO (for use as a normal function parameter/return).
    const auto makeIoVariable = [this](const char* name, TType& type, TStorageQualifier storage) -> TVariable* {
        TVariable* ioVariable = makeInternalVariable(name, type);
        clearUniformInputOutput(type.getQualifier());
        if (type.isStruct()) {
            auto newLists = ioTypeMap.find(ioVariable->getType().getStruct());
            if (newLists != ioTypeMap.end()) {
                if (storage == EvqVaryingIn && newLists->second.input)
                    ioVariable->getWritableType().setStruct(newLists->second.input);
                else if (storage == EvqVaryingOut && newLists->second.output)
                    ioVariable->getWritableType().setStruct(newLists->second.output);
            }
        }
        if (storage == EvqVaryingIn) {
            correctInput(ioVariable->getWritableType().getQualifier());
            if (language == EShLangTessEvaluation)
                if (!ioVariable->getType().isArray())
                    ioVariable->getWritableType().getQualifier().patch = true;
        } else {
            correctOutput(ioVariable->getWritableType().getQualifier());
        }
        ioVariable->getWritableType().getQualifier().storage = storage;

        fixBuiltInIoType(ioVariable->getWritableType());

        return ioVariable;
    };

    // return value is actually a shader-scoped output (out)
    if (function.getType().getBasicType() == EbtVoid) {
        returnValue = nullptr;
    } else {
        if (language == EShLangTessControl) {
            // tessellation evaluation in HLSL writes a per-ctrl-pt value, but it needs to be an
            // array in SPIR-V semantics.  We'll write to it indexed by invocation ID.

            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);

            TType outputType;
            outputType.shallowCopy(function.getType());

            // vertices has necessarily already been set when handling entry point attributes.
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(intermediate.getVertices());
            outputType.transferArraySizes(arraySizes);

            clearUniformInputOutput(function.getWritableType().getQualifier());
            returnValue = makeIoVariable("@entryPointOutput", outputType, EvqVaryingOut);
        } else {
            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);
        }
    }

    // parameters are actually shader-scoped inputs and outputs (in or out)
    for (int i = 0; i < function.getParamCount(); i++) {
        TType& paramType = *function[i].type;
        if (paramType.getQualifier().isParamInput()) {
            synthesizeEditedInput(paramType);
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingIn);
            inputs.push_back(argAsGlobal);
        }
        if (paramType.getQualifier().isParamOutput()) {
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingOut);
            outputs.push_back(argAsGlobal);
        }
    }
}